

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O1

char * __thiscall snappy::SnappySinkAllocator::Allocate(SnappySinkAllocator *this,int size)

{
  pointer *ppDVar1;
  iterator __position;
  ulong uVar2;
  size_t sVar3;
  Datablock block;
  Datablock local_20;
  
  sVar3 = (size_t)size;
  uVar2 = 0xffffffffffffffff;
  if (-1 < size) {
    uVar2 = sVar3;
  }
  local_20.data = (char *)operator_new__(uVar2);
  __position._M_current =
       (this->blocks_).
       super__Vector_base<snappy::SnappySinkAllocator::Datablock,_std::allocator<snappy::SnappySinkAllocator::Datablock>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->blocks_).
      super__Vector_base<snappy::SnappySinkAllocator::Datablock,_std::allocator<snappy::SnappySinkAllocator::Datablock>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_20.size = sVar3;
    std::
    vector<snappy::SnappySinkAllocator::Datablock,std::allocator<snappy::SnappySinkAllocator::Datablock>>
    ::_M_realloc_insert<snappy::SnappySinkAllocator::Datablock_const&>
              ((vector<snappy::SnappySinkAllocator::Datablock,std::allocator<snappy::SnappySinkAllocator::Datablock>>
                *)&this->blocks_,__position,&local_20);
  }
  else {
    (__position._M_current)->data = local_20.data;
    (__position._M_current)->size = sVar3;
    ppDVar1 = &(this->blocks_).
               super__Vector_base<snappy::SnappySinkAllocator::Datablock,_std::allocator<snappy::SnappySinkAllocator::Datablock>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppDVar1 = *ppDVar1 + 1;
  }
  return local_20.data;
}

Assistant:

char* Allocate(int size) {
    Datablock block(new char[size], size);
    blocks_.push_back(block);
    return block.data;
  }